

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcipher.cpp
# Opt level: O2

void __thiscall QSslCipher::QSslCipher(QSslCipher *this,QSslCipher *other)

{
  _Head_base<0UL,_QSslCipherPrivate_*,_false> this_00;
  
  this_00._M_head_impl = (QSslCipherPrivate *)operator_new(0x98);
  (this_00._M_head_impl)->isNull = true;
  *(qsizetype *)((long)&(this_00._M_head_impl)->protocolString + 0x10) = 0;
  ((this_00._M_head_impl)->protocolString).d.d = (Data *)0x0;
  *(char16_t **)((long)&(this_00._M_head_impl)->protocolString + 8) = (char16_t *)0x0;
  ((this_00._M_head_impl)->name).d.d = (Data *)0x0;
  *(char16_t **)((long)&(this_00._M_head_impl)->name + 8) = (char16_t *)0x0;
  *(qsizetype *)((long)&(this_00._M_head_impl)->name + 0x10) = 0;
  (this_00._M_head_impl)->supportedBits = 0;
  (this_00._M_head_impl)->bits = 0;
  ((this_00._M_head_impl)->keyExchangeMethod).d.d = (Data *)0x0;
  *(char16_t **)((long)&(this_00._M_head_impl)->keyExchangeMethod + 8) = (char16_t *)0x0;
  *(qsizetype *)((long)&(this_00._M_head_impl)->keyExchangeMethod + 0x10) = 0;
  ((this_00._M_head_impl)->authenticationMethod).d.d = (Data *)0x0;
  *(char16_t **)((long)&(this_00._M_head_impl)->authenticationMethod + 8) = (char16_t *)0x0;
  *(qsizetype *)((long)&(this_00._M_head_impl)->authenticationMethod + 0x10) = 0;
  ((this_00._M_head_impl)->encryptionMethod).d.d = (Data *)0x0;
  *(char16_t **)((long)&(this_00._M_head_impl)->encryptionMethod + 8) = (char16_t *)0x0;
  *(undefined8 *)((long)&(this_00._M_head_impl)->encryptionMethod + 9) = 0;
  *(undefined8 *)((long)&(this_00._M_head_impl)->encryptionMethod + 0x11) = 0;
  (this_00._M_head_impl)->protocol = UnknownProtocol;
  (this->d)._M_t.super___uniq_ptr_impl<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>.
  _M_t.super__Tuple_impl<0UL,_QSslCipherPrivate_*,_std::default_delete<QSslCipherPrivate>_>.
  super__Head_base<0UL,_QSslCipherPrivate_*,_false>._M_head_impl = this_00._M_head_impl;
  QSslCipherPrivate::operator=
            (this_00._M_head_impl,
             (other->d)._M_t.
             super___uniq_ptr_impl<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>._M_t.
             super__Tuple_impl<0UL,_QSslCipherPrivate_*,_std::default_delete<QSslCipherPrivate>_>.
             super__Head_base<0UL,_QSslCipherPrivate_*,_false>._M_head_impl);
  return;
}

Assistant:

QSslCipher::QSslCipher(const QSslCipher &other)
    : d(new QSslCipherPrivate)
{
    *d.get() = *other.d.get();
}